

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

int omac_acpkm_imit_ctrl(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  int iVar2;
  EVP_MD *pEVar3;
  code *pcVar4;
  EVP_CIPHER *pEVar5;
  long lVar6;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  EVP_MD_CTX *in_RDI;
  OMAC_ACPKM_CTX *c_2;
  OSSL_PARAM params [2];
  size_t cipher_key_mesh;
  OMAC_ACPKM_CTX *c_1;
  gost_mac_key *key;
  int ret;
  EVP_CIPHER *cipher;
  EVP_MD *md;
  OMAC_ACPKM_CTX *c;
  char *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  uchar *in_stack_ffffffffffffff18;
  undefined1 *__dest;
  undefined4 in_stack_ffffffffffffff20;
  OMAC_ACPKM_CTX *in_stack_ffffffffffffff28;
  undefined1 local_d0 [40];
  undefined1 local_a8 [80];
  long local_58;
  long *local_50;
  int *local_48;
  int local_3c;
  EVP_CIPHER *local_38;
  EVP_MD *local_30;
  long local_28;
  int *local_20;
  int local_18;
  EVP_MD_CTX *local_10;
  
  local_18 = in_EDX;
  if (in_ESI != 3) {
    local_20 = in_RCX;
    local_10 = in_RDI;
    if (in_ESI == 0x20) {
      local_50 = (long *)EVP_MD_CTX_get0_md_data(in_RDI);
      if (local_18 != 0) {
        iVar1 = local_18;
        pEVar3 = EVP_MD_CTX_md(local_10);
        iVar2 = EVP_MD_get_block_size(pEVar3);
        if (iVar1 % iVar2 == 0) {
          *(int *)(*local_50 + 0x84) = local_18;
          if ((local_20 != (int *)0x0) && (*local_20 != 0)) {
            pEVar5 = EVP_CIPHER_CTX_cipher(*(EVP_CIPHER_CTX **)(*local_50 + 8));
            lVar6 = EVP_CIPHER_get0_provider(pEVar5);
            if (lVar6 == 0) {
              iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(*local_50 + 8),0x20,*local_20,
                                          (void *)0x0);
              if (iVar1 == 0) {
                return 0;
              }
            }
            else {
              local_58 = (long)*local_20;
              memset(local_a8,0,0x50);
              __dest = local_a8;
              OSSL_PARAM_construct_size_t(local_d0,"key-mesh",&local_58);
              memcpy(__dest,local_d0,0x28);
              iVar1 = EVP_CIPHER_CTX_set_params(*(undefined8 *)(*local_50 + 8),local_a8);
              if (iVar1 == 0) {
                return 0;
              }
            }
          }
          return 1;
        }
      }
      return -1;
    }
    if (in_ESI == 0x1003) {
      *in_RCX = 0x20;
      return 1;
    }
    if (in_ESI == 0x1004) {
      local_28 = EVP_MD_CTX_get0_md_data(in_RDI);
      local_30 = EVP_MD_CTX_md(local_10);
      local_38 = (EVP_CIPHER *)0x0;
      local_3c = 0;
      if ((*(long *)(local_28 + 0x10) == 0) &&
         ((iVar1 = EVP_MD_is_a(local_30,"kuznyechik-mac"), iVar1 != 0 ||
          (iVar1 = EVP_MD_is_a(local_30,"kuznyechik-ctr-acpkm-omac"), iVar1 != 0)))) {
        *(char **)(local_28 + 0x10) = "kuznyechik-cbc";
      }
      local_38 = EVP_get_cipherbyname(*(char **)(local_28 + 0x10));
      if ((local_38 == (EVP_CIPHER *)0x0) &&
         (local_38 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,*(undefined8 *)(local_28 + 0x10)),
         local_38 == (EVP_CIPHER *)0x0)) {
        ERR_GOST_error(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                       ,0);
      }
      pEVar3 = EVP_MD_CTX_md(local_10);
      pcVar4 = (code *)EVP_MD_meth_get_init(pEVar3);
      iVar1 = (*pcVar4)(local_10);
      if (iVar1 < 1) {
        ERR_GOST_error(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                       ,0);
      }
      else {
        EVP_MD_CTX_set_flags(local_10,0x100);
        if (*(int *)(local_28 + 0x18) == 0) {
          if (local_18 == 0) {
            local_48 = local_20;
            local_3c = omac_acpkm_key(in_stack_ffffffffffffff28,
                                      (EVP_CIPHER *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff18,
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
            ;
          }
          else if (local_18 == 0x20) {
            local_3c = omac_acpkm_key(in_stack_ffffffffffffff28,
                                      (EVP_CIPHER *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff18,
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
            ;
          }
          else {
            ERR_GOST_error(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff08,0);
          }
        }
        else {
          ERR_GOST_error(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08,0);
        }
      }
      EVP_CIPHER_free(local_38);
      return local_3c;
    }
    return 0;
  }
  lVar6 = EVP_MD_CTX_get0_md_data(in_RDI);
  iVar1 = OBJ_txt2nid(*(char **)(lVar6 + 0x10));
  if (iVar1 == 0x3f7) {
    if ((local_18 < 1) || (0x10 < local_18)) {
      ERR_GOST_error(0x3f7,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0);
      return 0;
    }
    *(long *)(lVar6 + 8) = (long)local_18;
  }
  else {
    if (iVar1 != 0x4a6) {
      return 0;
    }
    if ((local_18 < 1) || (8 < local_18)) {
      ERR_GOST_error(0x4a6,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0);
      return 0;
    }
    *(long *)(lVar6 + 8) = (long)local_18;
  }
  return 1;
}

Assistant:

int omac_acpkm_imit_ctrl(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_KEY_LEN:
        *((unsigned int *)(ptr)) = 32;
        return 1;
    case EVP_MD_CTRL_SET_KEY:
        {
            OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
            const EVP_MD *md = EVP_MD_CTX_md(ctx);
            EVP_CIPHER *cipher = NULL;
            int ret = 0;

            if (c->cipher_name == NULL) {
                if (EVP_MD_is_a(md, SN_grasshopper_mac)
                    || EVP_MD_is_a(md, SN_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac))
                    c->cipher_name = SN_grasshopper_cbc;
            }
            if ((cipher =
                 (EVP_CIPHER *)EVP_get_cipherbyname(c->cipher_name)) == NULL
                && (cipher =
                    EVP_CIPHER_fetch(NULL, c->cipher_name, NULL)) == NULL) {
                GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_CIPHER_NOT_FOUND);
            }
            if (EVP_MD_meth_get_init(EVP_MD_CTX_md(ctx)) (ctx) <= 0) {
                GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_MAC_KEY_NOT_SET);
                goto set_key_end;
            }
            EVP_MD_CTX_set_flags(ctx, EVP_MD_CTX_FLAG_NO_INIT);
            if (c->key_set) {
                GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_BAD_ORDER);
                goto set_key_end;
            }
            if (arg == 0) {
                struct gost_mac_key *key = (struct gost_mac_key *)ptr;
                ret = omac_acpkm_key(c, cipher, key->key, 32);
                goto set_key_end;
            } else if (arg == 32) {
                ret = omac_acpkm_key(c, cipher, ptr, 32);
                goto set_key_end;
            }
            GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_INVALID_MAC_KEY_SIZE);
          set_key_end:
            EVP_CIPHER_free(cipher);
            return ret;
        }
    case EVP_CTRL_KEY_MESH:
        {
            OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
            if (!arg || (arg % EVP_MD_block_size(EVP_MD_CTX_md(ctx))))
                return -1;
            c->cmac_ctx->section_size = arg;
            if (ptr && *(int *)ptr) {
                /* Set parameter T */
                if (EVP_CIPHER_get0_provider(EVP_CIPHER_CTX_cipher(c->cmac_ctx->actx))
                    == NULL) {
                    if (!EVP_CIPHER_CTX_ctrl(c->cmac_ctx->actx, EVP_CTRL_KEY_MESH,
                                             *(int *)ptr, NULL))
                        return 0;
                } else {
                    size_t cipher_key_mesh = (size_t)*(int *)ptr;
                    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
                    params[0] = OSSL_PARAM_construct_size_t("key-mesh",
                                                            &cipher_key_mesh);
                    if (!EVP_CIPHER_CTX_set_params(c->cmac_ctx->actx, params))
                        return 0;
                }
            }
            return 1;
        }
    case EVP_MD_CTRL_XOF_LEN:   /* Supported in OpenSSL */
        {
            OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
            switch (OBJ_txt2nid(c->cipher_name)) {
            case NID_grasshopper_cbc:
                if (arg < 1 || arg > 16) {
                    GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            case NID_magma_cbc:
                if (arg < 1 || arg > 8) {
                    GOSTerr(GOST_F_OMAC_ACPKM_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            default:
                return 0;
            }
            return 1;
        }

    default:
        return 0;
    }
}